

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_getuint16(jas_stream_t *in,uint_fast16_t *val)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = 0xffffffff;
  if ((in->flags_ & 7U) == 0) {
    if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
      iVar4 = in->cnt_;
      in->cnt_ = iVar4 + -1;
      if (iVar4 < 1) {
        uVar2 = jas_stream_fillbuf(in,1);
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar1 = in->ptr_;
        in->ptr_ = pbVar1 + 1;
        uVar2 = (uint)*pbVar1;
      }
    }
    else {
      in->flags_ = in->flags_ | 4;
    }
  }
  iVar4 = -1;
  if (uVar2 != 0xffffffff) {
    uVar3 = 0xffffffff;
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar4 = in->cnt_;
        in->cnt_ = iVar4 + -1;
        if (iVar4 < 1) {
          uVar3 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          uVar3 = (uint)*pbVar1;
        }
      }
      else {
        in->flags_ = in->flags_ | 4;
        uVar3 = 0xffffffff;
      }
    }
    iVar4 = -1;
    if (uVar3 != 0xffffffff) {
      iVar4 = 0;
      if (val != (uint_fast16_t *)0x0) {
        *val = (long)(int)uVar3 | (long)(int)uVar2 << 8;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int jpc_getuint16(jas_stream_t *in, uint_fast16_t *val)
{
	uint_fast16_t v;
	int c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if (val) {
		*val = v;
	}
	return 0;
}